

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TexSubImageCubeEmptyTexCase::createTexture
          (TexSubImageCubeEmptyTexCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 format;
  deUint32 type;
  uint uVar3;
  deUint32 dVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int height;
  long lVar8;
  int ndx;
  long lVar9;
  uint uVar10;
  float fVar11;
  uint local_10c;
  deUint32 tex;
  int local_fc;
  ulong local_f8;
  ContextWrapper *local_f0;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  PixelBufferAccess local_a8;
  TextureLevel data;
  float local_58 [6];
  Random rnd;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_10c = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar10 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar6 = 0x20;
    if (uVar10 != 0) {
      uVar6 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    uVar10 = (this->super_TextureSpecCase).m_height;
    if (uVar10 != 0) {
      uVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar7 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar6)) {
      iVar7 = 0x1f - uVar6;
    }
    local_10c = iVar7 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_f0 = this_00;
  if (local_10c != 0) {
    uVar10 = 0;
    do {
      iVar7 = (this->super_TextureSpecCase).m_width >> ((byte)uVar10 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      height = (this->super_TextureSpecCase).m_height >> ((byte)uVar10 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      lVar8 = 0;
      do {
        sglr::ContextWrapper::glTexImage2D
                  (local_f0,*(deUint32 *)((long)&s_cubeMapFaces + lVar8),uVar10,this->m_format,iVar7
                   ,height,0,this->m_format,this->m_dataType,(void *)0x0);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x18);
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_10c);
    uVar5 = 0;
    do {
      local_fc = (this->super_TextureSpecCase).m_width >> ((byte)uVar5 & 0x1f);
      if (local_fc < 2) {
        local_fc = 1;
      }
      iVar7 = (this->super_TextureSpecCase).m_height >> ((byte)uVar5 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      local_f8 = uVar5;
      tcu::TextureLevel::setSize(&data,local_fc,iVar7,1);
      lVar8 = 0;
      do {
        local_a8.super_ConstPixelBufferAccess.m_format.order = R;
        local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        gMax.m_data[0] = 1.0;
        gMax.m_data[1] = 1.0;
        gMax.m_data[2] = 1.0;
        gMax.m_data[3] = 1.0;
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar9 = 0;
        do {
          fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2];
          fVar2 = gMax.m_data[lVar9];
          fVar11 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar9] = (fVar2 - fVar1) * fVar11 + fVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        local_a8.super_ConstPixelBufferAccess.m_format.order = R;
        local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        local_58[0] = 1.0;
        local_58[1] = 1.0;
        local_58[2] = 1.0;
        local_58[3] = 1.0;
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar9 = 0;
        do {
          fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2];
          fVar2 = local_58[lVar9];
          fVar11 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar9] = (fVar2 - fVar1) * fVar11 + fVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        tcu::TextureLevel::getAccess(&local_a8,&data);
        tcu::fillWithComponentGradients(&local_a8,&gMin,&gMax);
        dVar4 = (&s_cubeMapFaces)[lVar8];
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_a8,&data);
        sglr::ContextWrapper::glTexSubImage2D
                  (local_f0,dVar4,(int)local_f8,0,0,local_fc,iVar7,format,type,
                   local_a8.super_ConstPixelBufferAccess.m_data);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      uVar10 = (int)local_f8 + 1;
      uVar5 = (ulong)uVar10;
    } while (uVar10 != local_10c);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Specify storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify data using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}